

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_MappingUpdateLevel_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode,int fMaximum)

{
  int iVar1;
  int b;
  int LevelE;
  int Level2;
  int Level1;
  Fraig_Node_t *pTemp;
  int fMaximum_local;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *pMan_local;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigUtil.c"
                  ,0x1c5,"int Fraig_MappingUpdateLevel_rec(Fraig_Man_t *, Fraig_Node_t *, int)");
  }
  iVar1 = Fraig_NodeIsAnd(pNode);
  if (iVar1 == 0) {
    pMan_local._4_4_ = pNode->Level;
  }
  else if (pNode->TravId == pMan->nTravIds) {
    pMan_local._4_4_ = pNode->Level;
  }
  else {
    pNode->TravId = pMan->nTravIds;
    iVar1 = Fraig_MappingUpdateLevel_rec
                      (pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),fMaximum);
    b = Fraig_MappingUpdateLevel_rec
                  (pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),fMaximum);
    iVar1 = Abc_MaxInt(iVar1,b);
    pNode->Level = iVar1 + 1;
    if (pNode->pNextE != (Fraig_Node_t *)0x0) {
      iVar1 = Fraig_MappingUpdateLevel_rec(pMan,pNode->pNextE,fMaximum);
      if (fMaximum == 0) {
        if (iVar1 < pNode->Level) {
          pNode->Level = iVar1;
        }
      }
      else if (pNode->Level < iVar1) {
        pNode->Level = iVar1;
      }
      if (pNode->pRepr == (Fraig_Node_t *)0x0) {
        for (_Level2 = pNode->pNextE; _Level2 != (Fraig_Node_t *)0x0; _Level2 = _Level2->pNextE) {
          _Level2->Level = pNode->Level;
        }
      }
    }
    pMan_local._4_4_ = pNode->Level;
  }
  return pMan_local._4_4_;
}

Assistant:

int Fraig_MappingUpdateLevel_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode, int fMaximum )
{
    Fraig_Node_t * pTemp;
    int Level1, Level2, LevelE;
    assert( !Fraig_IsComplement(pNode) );
    if ( !Fraig_NodeIsAnd(pNode) )
        return pNode->Level;
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return pNode->Level;
    pNode->TravId = pMan->nTravIds;
    // compute levels of the children nodes
    Level1 = Fraig_MappingUpdateLevel_rec( pMan, Fraig_Regular(pNode->p1), fMaximum );
    Level2 = Fraig_MappingUpdateLevel_rec( pMan, Fraig_Regular(pNode->p2), fMaximum );
    pNode->Level = 1 + Abc_MaxInt( Level1, Level2 );
    if ( pNode->pNextE )
    {
        LevelE = Fraig_MappingUpdateLevel_rec( pMan, pNode->pNextE, fMaximum );
        if ( fMaximum )
        {
            if ( pNode->Level < LevelE )
                pNode->Level = LevelE;
        }
        else
        {
            if ( pNode->Level > LevelE )
                pNode->Level = LevelE;
        }
        // set the level of all equivalent nodes to be the same minimum
        if ( pNode->pRepr == NULL ) // the primary node
            for ( pTemp = pNode->pNextE; pTemp; pTemp = pTemp->pNextE )
                pTemp->Level = pNode->Level;
    }
    return pNode->Level;
}